

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O2

CURLcode Curl_sasl_continue(SASL *sasl,Curl_easy *data,int code,saslprogress *progress)

{
  saslstate sVar1;
  connectdata *pcVar2;
  char *bearer;
  CURLcode CVar3;
  SASLproto *pSVar4;
  saslstate sVar5;
  char *service;
  bufref resp;
  int port;
  bufref serverdata;
  char *hostname;
  char *disp_hostname;
  
  service = (data->set).str[0xc];
  if (service == (char *)0x0) {
    service = sasl->params->service;
  }
  pcVar2 = data->conn;
  bearer = (data->set).str[0x3c];
  Curl_conn_get_host(data,0,&hostname,&disp_hostname,&port);
  Curl_bufref_init(&serverdata);
  Curl_bufref_init(&resp);
  *progress = SASL_INPROGRESS;
  sVar1 = sasl->state;
  if (sVar1 == SASL_FINAL) {
    CVar3 = CURLE_LOGIN_DENIED;
    if (sasl->params->finalcode == code) {
      CVar3 = CURLE_OK;
    }
    *progress = SASL_DONE;
    sasl->state = SASL_STOP;
    return CVar3;
  }
  if (sVar1 == SASL_CANCEL) {
    sasl->authmechs = sasl->authmechs ^ sasl->authused;
    CVar3 = Curl_sasl_start(sasl,data,(_Bool)((sasl->field_0x1e & 4) >> 2),progress);
    return CVar3;
  }
  sVar5 = SASL_FINAL;
  if (sVar1 == SASL_OAUTH2_RESP) {
    pSVar4 = sasl->params;
switchD_0011f922_caseD_e:
    if (pSVar4->finalcode == code) {
      *progress = SASL_DONE;
      sasl->state = SASL_STOP;
      return CURLE_OK;
    }
    if (pSVar4->contcode != code) {
LAB_0011f98b:
      *progress = SASL_DONE;
      sasl->state = SASL_STOP;
      return CURLE_LOGIN_DENIED;
    }
    Curl_bufref_set(&resp,"\x01",1,(_func_void_void_ptr *)0x0);
    goto switchD_0011f922_caseD_7;
  }
  pSVar4 = sasl->params;
  if (pSVar4->contcode != code) goto LAB_0011f98b;
  switch(sVar1) {
  case SASL_STOP:
    *progress = SASL_DONE;
    return CURLE_OK;
  case SASL_PLAIN:
    CVar3 = Curl_auth_create_plain_message(pcVar2->sasl_authzid,pcVar2->user,pcVar2->passwd,&resp);
LAB_0011fbad:
    sVar5 = SASL_FINAL;
    goto LAB_0011fbb3;
  case SASL_LOGIN:
    Curl_auth_create_login_message(pcVar2->user,&resp);
    sVar5 = SASL_LOGIN_PASSWD;
    break;
  case SASL_LOGIN_PASSWD:
    Curl_auth_create_login_message(pcVar2->passwd,&resp);
    break;
  case SASL_EXTERNAL:
    Curl_auth_create_external_message(pcVar2->user,&resp);
    break;
  case SASL_CRAMMD5:
    CVar3 = get_server_message(sasl,data,&serverdata);
    if (CVar3 == CURLE_OK) {
      CVar3 = Curl_auth_create_cram_md5_message(&serverdata,pcVar2->user,pcVar2->passwd,&resp);
    }
    goto LAB_0011fb7a;
  case SASL_DIGESTMD5:
    CVar3 = get_server_message(sasl,data,&serverdata);
    if ((CVar3 != CURLE_OK) ||
       (CVar3 = Curl_auth_create_digest_md5_message
                          (data,&serverdata,pcVar2->user,pcVar2->passwd,service,&resp),
       CVar3 != CURLE_OK)) goto LAB_0011fb7a;
    sVar5 = SASL_DIGESTMD5_RESP;
    if ((sasl->params->flags & 1) == 0) {
      sVar5 = SASL_FINAL;
    }
    break;
  case SASL_DIGESTMD5_RESP:
    break;
  case SASL_NTLM:
    CVar3 = Curl_auth_create_ntlm_type1_message
                      (data,pcVar2->user,pcVar2->passwd,service,hostname,&pcVar2->ntlm,&resp);
    sVar5 = SASL_NTLM_TYPE2MSG;
    goto LAB_0011fbb3;
  case SASL_NTLM_TYPE2MSG:
    CVar3 = get_server_message(sasl,data,&serverdata);
    if (CVar3 == CURLE_OK) {
      CVar3 = Curl_auth_decode_ntlm_type2_message(data,&serverdata,&pcVar2->ntlm);
      if (CVar3 == CURLE_OK) {
        CVar3 = Curl_auth_create_ntlm_type3_message
                          (data,pcVar2->user,pcVar2->passwd,&pcVar2->ntlm,&resp);
      }
    }
LAB_0011fb7a:
    sVar5 = SASL_FINAL;
    goto LAB_0011fbb3;
  default:
    Curl_failf(data,"Unsupported SASL authentication mechanism");
    Curl_bufref_free(&serverdata);
    CVar3 = CURLE_UNSUPPORTED_PROTOCOL;
    goto LAB_0011fbe7;
  case SASL_OAUTH2:
    if (sasl->authused != 0x100) {
      CVar3 = Curl_auth_create_xoauth_bearer_message(pcVar2->user,bearer,&resp);
      goto LAB_0011fbad;
    }
    CVar3 = Curl_auth_create_oauth_bearer_message(pcVar2->user,hostname,(long)port,bearer,&resp);
    sVar5 = SASL_OAUTH2_RESP;
LAB_0011fbb3:
    Curl_bufref_free(&serverdata);
    if (CVar3 != CURLE_OK) {
      if (CVar3 == CURLE_BAD_CONTENT_ENCODING) {
        CVar3 = (*sasl->params->cancelauth)(data,sasl->curmech);
        sVar5 = SASL_CANCEL;
      }
      else {
LAB_0011fbe7:
        *progress = SASL_DONE;
        sVar5 = SASL_STOP;
      }
      goto LAB_0011f97b;
    }
    goto LAB_0011f951;
  case SASL_OAUTH2_RESP:
    goto switchD_0011f922_caseD_e;
  }
switchD_0011f922_caseD_7:
  Curl_bufref_free(&serverdata);
LAB_0011f951:
  CVar3 = build_message(sasl,&resp);
  if (CVar3 == CURLE_OK) {
    CVar3 = (*sasl->params->contauth)(data,sasl->curmech,&resp);
  }
LAB_0011f97b:
  Curl_bufref_free(&resp);
  sasl->state = sVar5;
  return CVar3;
}

Assistant:

CURLcode Curl_sasl_continue(struct SASL *sasl, struct Curl_easy *data,
                            int code, saslprogress *progress)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  saslstate newstate = SASL_FINAL;
  struct bufref resp;
  const char *hostname, *disp_hostname;
  int port;
#if defined(USE_KERBEROS5) || defined(USE_NTLM) \
    || !defined(CURL_DISABLE_DIGEST_AUTH)
  const char *service = data->set.str[STRING_SERVICE_NAME] ?
    data->set.str[STRING_SERVICE_NAME] :
    sasl->params->service;
#endif
  const char *oauth_bearer = data->set.str[STRING_BEARER];
  struct bufref serverdata;

  Curl_conn_get_host(data, FIRSTSOCKET, &hostname, &disp_hostname, &port);
  Curl_bufref_init(&serverdata);
  Curl_bufref_init(&resp);
  *progress = SASL_INPROGRESS;

  if(sasl->state == SASL_FINAL) {
    if(code != sasl->params->finalcode)
      result = CURLE_LOGIN_DENIED;
    *progress = SASL_DONE;
    sasl_state(sasl, data, SASL_STOP);
    return result;
  }

  if(sasl->state != SASL_CANCEL && sasl->state != SASL_OAUTH2_RESP &&
     code != sasl->params->contcode) {
    *progress = SASL_DONE;
    sasl_state(sasl, data, SASL_STOP);
    return CURLE_LOGIN_DENIED;
  }

  switch(sasl->state) {
  case SASL_STOP:
    *progress = SASL_DONE;
    return result;
  case SASL_PLAIN:
    result = Curl_auth_create_plain_message(conn->sasl_authzid,
                                            conn->user, conn->passwd, &resp);
    break;
  case SASL_LOGIN:
    Curl_auth_create_login_message(conn->user, &resp);
    newstate = SASL_LOGIN_PASSWD;
    break;
  case SASL_LOGIN_PASSWD:
    Curl_auth_create_login_message(conn->passwd, &resp);
    break;
  case SASL_EXTERNAL:
    Curl_auth_create_external_message(conn->user, &resp);
    break;
#ifdef USE_GSASL
  case SASL_GSASL:
    result = get_server_message(sasl, data, &serverdata);
    if(!result)
      result = Curl_auth_gsasl_token(data, &serverdata, &conn->gsasl, &resp);
    if(!result && Curl_bufref_len(&resp) > 0)
      newstate = SASL_GSASL;
    break;
#endif
#ifndef CURL_DISABLE_DIGEST_AUTH
  case SASL_CRAMMD5:
    result = get_server_message(sasl, data, &serverdata);
    if(!result)
      result = Curl_auth_create_cram_md5_message(&serverdata, conn->user,
                                                 conn->passwd, &resp);
    break;
  case SASL_DIGESTMD5:
    result = get_server_message(sasl, data, &serverdata);
    if(!result)
      result = Curl_auth_create_digest_md5_message(data, &serverdata,
                                                   conn->user, conn->passwd,
                                                   service, &resp);
    if(!result && (sasl->params->flags & SASL_FLAG_BASE64))
      newstate = SASL_DIGESTMD5_RESP;
    break;
  case SASL_DIGESTMD5_RESP:
    /* Keep response NULL to output an empty line. */
    break;
#endif

#ifdef USE_NTLM
  case SASL_NTLM:
    /* Create the type-1 message */
    result = Curl_auth_create_ntlm_type1_message(data,
                                                 conn->user, conn->passwd,
                                                 service, hostname,
                                                 &conn->ntlm, &resp);
    newstate = SASL_NTLM_TYPE2MSG;
    break;
  case SASL_NTLM_TYPE2MSG:
    /* Decode the type-2 message */
    result = get_server_message(sasl, data, &serverdata);
    if(!result)
      result = Curl_auth_decode_ntlm_type2_message(data, &serverdata,
                                                   &conn->ntlm);
    if(!result)
      result = Curl_auth_create_ntlm_type3_message(data, conn->user,
                                                   conn->passwd, &conn->ntlm,
                                                   &resp);
    break;
#endif

#if defined(USE_KERBEROS5)
  case SASL_GSSAPI:
    result = Curl_auth_create_gssapi_user_message(data, conn->user,
                                                  conn->passwd,
                                                  service,
                                                  conn->host.name,
                                                  sasl->mutual_auth, NULL,
                                                  &conn->krb5,
                                                  &resp);
    newstate = SASL_GSSAPI_TOKEN;
    break;
  case SASL_GSSAPI_TOKEN:
    result = get_server_message(sasl, data, &serverdata);
    if(!result) {
      if(sasl->mutual_auth) {
        /* Decode the user token challenge and create the optional response
           message */
        result = Curl_auth_create_gssapi_user_message(data, NULL, NULL,
                                                      NULL, NULL,
                                                      sasl->mutual_auth,
                                                      &serverdata,
                                                      &conn->krb5,
                                                      &resp);
        newstate = SASL_GSSAPI_NO_DATA;
      }
      else
        /* Decode the security challenge and create the response message */
        result = Curl_auth_create_gssapi_security_message(data,
                                                          conn->sasl_authzid,
                                                          &serverdata,
                                                          &conn->krb5,
                                                          &resp);
    }
    break;
  case SASL_GSSAPI_NO_DATA:
    /* Decode the security challenge and create the response message */
    result = get_server_message(sasl, data, &serverdata);
    if(!result)
      result = Curl_auth_create_gssapi_security_message(data,
                                                        conn->sasl_authzid,
                                                        &serverdata,
                                                        &conn->krb5,
                                                        &resp);
    break;
#endif

  case SASL_OAUTH2:
    /* Create the authorization message */
    if(sasl->authused == SASL_MECH_OAUTHBEARER) {
      result = Curl_auth_create_oauth_bearer_message(conn->user,
                                                     hostname,
                                                     port,
                                                     oauth_bearer,
                                                     &resp);

      /* Failures maybe sent by the server as continuations for OAUTHBEARER */
      newstate = SASL_OAUTH2_RESP;
    }
    else
      result = Curl_auth_create_xoauth_bearer_message(conn->user,
                                                      oauth_bearer,
                                                      &resp);
    break;

  case SASL_OAUTH2_RESP:
    /* The continuation is optional so check the response code */
    if(code == sasl->params->finalcode) {
      /* Final response was received so we are done */
      *progress = SASL_DONE;
      sasl_state(sasl, data, SASL_STOP);
      return result;
    }
    else if(code == sasl->params->contcode) {
      /* Acknowledge the continuation by sending a 0x01 response. */
      Curl_bufref_set(&resp, "\x01", 1, NULL);
      break;
    }
    else {
      *progress = SASL_DONE;
      sasl_state(sasl, data, SASL_STOP);
      return CURLE_LOGIN_DENIED;
    }

  case SASL_CANCEL:
    /* Remove the offending mechanism from the supported list */
    sasl->authmechs ^= sasl->authused;

    /* Start an alternative SASL authentication */
    return Curl_sasl_start(sasl, data, sasl->force_ir, progress);
  default:
    failf(data, "Unsupported SASL authentication mechanism");
    result = CURLE_UNSUPPORTED_PROTOCOL;  /* Should not happen */
    break;
  }

  Curl_bufref_free(&serverdata);

  switch(result) {
  case CURLE_BAD_CONTENT_ENCODING:
    /* Cancel dialog */
    result = sasl->params->cancelauth(data, sasl->curmech);
    newstate = SASL_CANCEL;
    break;
  case CURLE_OK:
    result = build_message(sasl, &resp);
    if(!result)
      result = sasl->params->contauth(data, sasl->curmech, &resp);
    break;
  default:
    newstate = SASL_STOP;    /* Stop on error */
    *progress = SASL_DONE;
    break;
  }

  Curl_bufref_free(&resp);

  sasl_state(sasl, data, newstate);

  return result;
}